

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_randomize(Integer g_a,void *val)

{
  float fVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  Integer I_elems;
  char err_string [256];
  long local_140;
  char *local_138 [33];
  
  iVar6 = _ga_sync_end;
  bVar12 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  iVar3 = GA[g_a + 1000].p_handle;
  if (bVar12) {
    pnga_pgroup_sync((long)iVar3);
  }
  if ((g_a < -1000) || ((long)_max_global_array <= g_a + 1000)) {
    sprintf((char *)local_138,"%s: INVALID ARRAY HANDLE","ga_randomize");
    pnga_error((char *)local_138,g_a);
  }
  if (GA[g_a + 1000].actv == 0) {
    sprintf((char *)local_138,"%s: ARRAY NOT ACTIVE","ga_randomize");
    pnga_error((char *)local_138,g_a);
  }
  iVar7 = (int)g_a + 1000;
  uVar8 = GA[iVar7].type - 1000;
  if ((0xff < uVar8) || (ga_types[uVar8].active == 0)) {
    pnga_error("type not yet supported",(long)GA[iVar7].type);
  }
  lVar10 = GA[iVar7].size / (long)GA[iVar7].elemsize;
  if (GA[iVar7].block_total < 0) {
    lVar11 = GAme;
    if (-1 < iVar3) {
      lVar11 = (long)PGRP_LIST[GA[iVar7].p_handle].map_proc_list[GAme];
    }
    pcVar5 = GA[iVar7].ptr[lVar11];
    iVar7 = GA[iVar7].type;
    local_138[0] = pcVar5;
    switch(iVar7) {
    case 0x3e9:
      if (0 < lVar10) {
        lVar11 = 0;
        do {
          iVar7 = *val;
          iVar9 = rand();
          *(int *)(pcVar5 + lVar11 * 4) =
               (int)((long)(iVar9 * iVar7) * 0x40000001 >> 0x3d) - (iVar9 * iVar7 >> 0x1f);
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      break;
    case 0x3ea:
      if (0 < lVar10) {
        lVar11 = 0;
        do {
          lVar4 = *val;
          iVar7 = rand();
          *(long *)(pcVar5 + lVar11 * 8) = (iVar7 * lVar4) / 0x7fffffff;
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      break;
    case 0x3eb:
      if (0 < lVar10) {
        lVar11 = 0;
        do {
          fVar1 = *val;
          iVar7 = rand();
          *(float *)(pcVar5 + lVar11 * 4) = (float)iVar7 * fVar1 * 4.656613e-10;
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      break;
    case 0x3ec:
      if (0 < lVar10) {
        lVar11 = 0;
        do {
          dVar2 = *val;
          iVar7 = rand();
          *(double *)(pcVar5 + lVar11 * 8) = ((double)iVar7 * dVar2) / 2147483647.0;
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      break;
    default:
      if (iVar7 == 0x3f8) {
        if (0 < lVar10) {
          lVar11 = 0;
          do {
            lVar4 = *val;
            iVar7 = rand();
            *(long *)(pcVar5 + lVar11 * 8) = (iVar7 * lVar4) / 0x7fffffff;
            lVar11 = lVar11 + 1;
          } while (lVar10 != lVar11);
        }
      }
      else {
        pnga_error("type not supported",(long)iVar7);
      }
    }
  }
  else {
    local_140 = lVar10;
    pnga_access_block_segment_ptr(g_a,GAme,local_138,&local_140);
    lVar10 = local_140;
    iVar7 = GA[iVar7].type;
    switch(iVar7) {
    case 0x3e9:
      if (0 < local_140) {
        lVar11 = 0;
        do {
          iVar7 = *val;
          iVar9 = rand();
          *(int *)(local_138[0] + lVar11 * 4) =
               (int)((long)(iVar9 * iVar7) * 0x40000001 >> 0x3d) - (iVar9 * iVar7 >> 0x1f);
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      break;
    case 0x3ea:
      if (0 < local_140) {
        lVar11 = 0;
        do {
          lVar4 = *val;
          iVar7 = rand();
          *(long *)(local_138[0] + lVar11 * 8) = (iVar7 * lVar4) / 0x7fffffff;
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      break;
    case 0x3eb:
      if (0 < local_140) {
        lVar11 = 0;
        do {
          fVar1 = *val;
          iVar7 = rand();
          *(float *)(local_138[0] + lVar11 * 4) = (float)iVar7 * fVar1 * 4.656613e-10;
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      break;
    case 0x3ec:
      if (0 < local_140) {
        lVar11 = 0;
        do {
          dVar2 = *val;
          iVar7 = rand();
          *(double *)(local_138[0] + lVar11 * 8) = ((double)iVar7 * dVar2) / 2147483647.0;
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      break;
    default:
      if (iVar7 == 0x3f8) {
        if (0 < local_140) {
          lVar11 = 0;
          do {
            lVar4 = *val;
            iVar7 = rand();
            *(long *)(local_138[0] + lVar11 * 8) = (iVar7 * lVar4) / 0x7fffffff;
            lVar11 = lVar11 + 1;
          } while (lVar10 != lVar11);
        }
      }
      else {
        pnga_error("type not supported",(long)iVar7);
      }
    }
    pnga_release_block_segment(g_a,GAme);
  }
  if (iVar6 != 0) {
    pnga_pgroup_sync((long)iVar3);
  }
  return;
}

Assistant:

void pnga_randomize(Integer g_a, void* val)
{
  int i,handle=GA_OFFSET + (int)g_a;
  char *ptr;
  int local_sync_begin,local_sync_end;
  C_Long elems;
  Integer grp_id;
  Integer num_blocks;


  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous sync masking*/
  grp_id = pnga_get_pgroup(g_a);
  if(local_sync_begin)pnga_pgroup_sync(grp_id);


  ga_check_handleM(g_a, "ga_randomize");
  gam_checktype(GA[handle].type);
  elems = GA[handle].size/((C_Long)GA[handle].elemsize);
  num_blocks = GA[handle].block_total;

  if (num_blocks < 0) {
    /* Bruce..Please CHECK if this is correct */
    if (grp_id >= 0){  
      Integer grp_me = PGRP_LIST[GA[handle].p_handle].map_proc_list[GAme];
      ptr = GA[handle].ptr[grp_me];
    }
    else  ptr = GA[handle].ptr[GAme];

    switch (GA[handle].type){
/*
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*) rand();
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
*/
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*) val * ((double)rand())/RAND_MAX;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*) val * ((int)rand())/RAND_MAX;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*) val * ((float)rand())/(size_t)RAND_MAX;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*) val * ((long)rand())/RAND_MAX;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*( long long*) val * ((long long)rand())/RAND_MAX;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
  } else {
    Integer I_elems = (Integer)elems;
    pnga_access_block_segment_ptr(g_a,GAme,&ptr,&I_elems);
    elems = (C_Long)I_elems;
    switch (GA[handle].type){
/*
      case C_DCPL: 
        for(i=0; i<elems;i++)((DoubleComplex*)ptr)[i]=*(DoubleComplex*)val;
        break;
      case C_SCPL: 
        for(i=0; i<elems;i++)((SingleComplex*)ptr)[i]=*(SingleComplex*)val;
        break;
*/
      case C_DBL:  
        for(i=0; i<elems;i++)((double*)ptr)[i]=*(double*)val * ((double)rand())/RAND_MAX;
        break;
      case C_INT:  
        for(i=0; i<elems;i++)((int*)ptr)[i]=*(int*)val * ((int)rand())/RAND_MAX;
        break;
      case C_FLOAT:
        for(i=0; i<elems;i++)((float*)ptr)[i]=*(float*)val * ((float)rand())/(size_t)RAND_MAX;
        break;     
      case C_LONG:
        for(i=0; i<elems;i++)((long*)ptr)[i]=*(long*)val * ((long)rand())/RAND_MAX;
        break;
      case C_LONGLONG:
        for(i=0; i<elems;i++)((long long*)ptr)[i]=*(long long*)val * ((long long)rand())/RAND_MAX;
        break;
      default:
        pnga_error("type not supported",GA[handle].type);
    }
    pnga_release_block_segment(g_a,GAme);
  }

  if(local_sync_end)pnga_pgroup_sync(grp_id);

}